

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O0

const_iterator avro::parsing::skipCalls(Scanner *sc,Decoder *d,const_iterator it,bool isArray)

{
  bool bVar1;
  undefined4 *puVar2;
  byte in_CL;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_RDX;
  Scanner *in_RDI;
  char c;
  int level;
  char end;
  undefined8 in_stack_fffffffffffffe88;
  undefined1 uVar3;
  assertion_result *in_stack_fffffffffffffe90;
  assertion_result *this;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>
  *in_stack_fffffffffffffe98;
  lazy_ostream *prev;
  undefined6 in_stack_fffffffffffffec8;
  undefined1 uVar4;
  char cVar5;
  iterator in_stack_fffffffffffffed0;
  const_string *in_stack_fffffffffffffed8;
  unit_test_log_t *in_stack_fffffffffffffee0;
  assertion_result local_100;
  lazy_ostream local_d8;
  basic_cstring<const_char> local_c8 [4];
  lazy_ostream local_88 [2];
  assertion_result local_68;
  basic_cstring<const_char> local_40;
  char local_29;
  int local_28;
  char local_22;
  byte local_21;
  
  local_21 = in_CL & 1;
  uVar4 = 0x7d;
  cVar5 = ']';
  if (local_21 == 0) {
    cVar5 = '}';
  }
  local_28 = 0;
  local_22 = cVar5;
  do {
    bVar1 = Scanner::isDone(in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      do {
        uVar3 = (undefined1)((ulong)in_stack_fffffffffffffe88 >> 0x38);
        prev = &local_d8;
        this = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)prev,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                   ,0x6d);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)this);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                   (size_t)in_stack_fffffffffffffed0,
                   (const_string *)CONCAT17(cVar5,CONCAT16(uVar4,in_stack_fffffffffffffec8)));
        boost::test_tools::assertion_result::assertion_result(this,(bool)uVar3);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<(prev,(char (*) [33])this);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)&stack0xfffffffffffffed0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                   ,0x6d);
        in_stack_fffffffffffffe88 = 0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_100,(lazy_ostream *)&stack0xfffffffffffffee0,
                   (const_string *)&stack0xfffffffffffffed0,0x169,REQUIRE,CHECK_MSG);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>
                            *)0x23d720);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x23d72a);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 0;
      __cxa_throw(puVar2,&int::typeinfo,0);
    }
    local_29 = Scanner::advance(in_RDI);
    switch(local_29) {
    case 'B':
    case 'D':
    case 'F':
    case 'I':
    case 'L':
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&stack0xfffffffffffffff0);
      break;
    default:
      do {
        uVar3 = (undefined1)((ulong)in_stack_fffffffffffffe88 >> 0x38);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                   ,0x6d);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffe90);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                   (size_t)in_stack_fffffffffffffed0,
                   (const_string *)CONCAT17(cVar5,CONCAT16(uVar4,in_stack_fffffffffffffec8)));
        boost::test_tools::assertion_result::assertion_result(in_stack_fffffffffffffe90,(bool)uVar3)
        ;
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (&in_stack_fffffffffffffe98->super_lazy_ostream,
                   (char (*) [25])in_stack_fffffffffffffe90);
        boost::unit_test::operator<<(in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (local_c8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                   ,0x6d);
        in_stack_fffffffffffffe88 = 0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_68,local_88,local_c8,0x166,REQUIRE,CHECK_MSG);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>,_char,_const_char_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>,_char,_const_char_&>
                    *)0x23d5b3);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>
                            *)0x23d5c0);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x23d5cd);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      break;
    case 'K':
    case 'S':
    case 'b':
    case 'e':
    case 'f':
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&stack0xfffffffffffffff0);
    case 'U':
    case 'c':
      Scanner::extractInt((Scanner *)in_stack_fffffffffffffe90);
      break;
    case 'N':
    case 'R':
    case 's':
      break;
    case '[':
    case '{':
      local_28 = local_28 + 1;
      break;
    case ']':
    case '}':
      if ((local_29 == local_22) && (local_28 == 0)) {
        return (const_iterator)in_RDX._M_current;
      }
      local_28 = local_28 + -1;
    }
  } while( true );
}

Assistant:

static vector<string>::const_iterator skipCalls(Scanner& sc, Decoder& d,
    vector<string>::const_iterator it, bool isArray)
{
    char end = isArray ? ']' : '}';
    int level = 0;
    while (! sc.isDone()) {
        char c = sc.advance();
        switch (c) {
        case '[':
        case '{':
            ++level;
            break;
        case ']':
        case '}':
            if (c == end && level == 0) {
                return it;
            }
            --level;
            break;
        case 'B':
        case 'I':
        case 'L':
        case 'F':
        case 'D':
            ++it;
            break;
        case 'S':
        case 'K':
        case 'b':
        case 'f':
        case 'e':
            ++it;       // Fall through.
        case 'c':
        case 'U':
            sc.extractInt();
            break;
        case 's':
        case 'N':
        case 'R':
            break;
        default:
            BOOST_FAIL("Don't know how to skip: " << c);
        }
    }
    BOOST_FAIL("End reached while trying to skip");
    throw 0;    // Just to keep the compiler happy.
}